

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O1

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::doSelection(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              *this,Clause *c,uint eligible)

{
  LiteralList *pLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Cell *pCVar5;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
  *pCVar6;
  int iVar7;
  size_t i;
  TermList TVar8;
  TermList TVar9;
  LiteralList *pLVar10;
  Literal **ppLVar11;
  size_t i_2;
  ulong uVar12;
  List<Kernel::Literal_*> *pLVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 uVar17;
  Literal **res;
  Literal *pLVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  LiteralList *maximals;
  bool dummy_2;
  bool dummy;
  Set<Kernel::Literal_*,_Lib::DefaultHash> maxSet;
  LiteralList *local_e0;
  bool local_d5;
  uint local_d4;
  Literal *local_d0;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
  *local_c8;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>
  local_c0;
  
  if (CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
      ::doSelection(Kernel::Clause*,unsigned_int)::combSup == '\0') {
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
    ::doSelection();
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::litArr == '\0') &&
     (iVar7 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::litArr), iVar7 != 0)
     ) {
    doSelection::litArr._size = 0x40;
    doSelection::litArr._capacity = 0x40;
    ppLVar11 = (Literal **)::operator_new(0x200,0x10);
    if (doSelection::litArr._capacity != 0) {
      memset(ppLVar11,0,doSelection::litArr._capacity << 3);
    }
    doSelection::litArr._array = ppLVar11;
    __cxa_atexit(::Lib::DArray<Kernel::Literal_*>::~DArray,&doSelection::litArr,&__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::litArr);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads == '\0') &&
     (iVar7 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads),
     iVar7 != 0)) {
    doSelection::maxTermHeads._capacity = 0;
    doSelection::maxTermHeads._nonemptyCells = 0;
    doSelection::maxTermHeads._size = 0;
    doSelection::maxTermHeads._entries = (Cell *)0x0;
    ::Lib::Set<unsigned_int,_Lib::DefaultHash>::expand(&doSelection::maxTermHeads);
    __cxa_atexit(::Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set,&doSelection::maxTermHeads,
                 &__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads);
  }
  pCVar5 = doSelection::maxTermHeads._entries;
  auVar4 = _DAT_00871040;
  auVar3 = _DAT_00871030;
  auVar2 = _DAT_00871020;
  if (doSelection::maxTermHeads._entries != doSelection::maxTermHeads._afterLast) {
    uVar12 = (long)doSelection::maxTermHeads._afterLast +
             (-8 - (long)doSelection::maxTermHeads._entries);
    auVar24._8_4_ = (int)uVar12;
    auVar24._0_8_ = uVar12;
    auVar24._12_4_ = (int)(uVar12 >> 0x20);
    auVar22._0_8_ = uVar12 >> 3;
    auVar22._8_8_ = auVar24._8_8_ >> 3;
    uVar15 = 0;
    auVar22 = auVar22 ^ _DAT_00871040;
    do {
      auVar23._8_4_ = (int)uVar15;
      auVar23._0_8_ = uVar15;
      auVar23._12_4_ = (int)(uVar15 >> 0x20);
      auVar24 = (auVar23 | auVar3) ^ auVar4;
      iVar7 = auVar22._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar7 && auVar22._0_4_ < auVar24._0_4_ || iVar7 < auVar24._4_4_)
                & 1)) {
        pCVar5[uVar15].code = 0;
      }
      if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
          auVar24._12_4_ <= auVar22._12_4_) {
        pCVar5[uVar15 + 1].code = 0;
      }
      auVar24 = (auVar23 | auVar2) ^ auVar4;
      iVar25 = auVar24._4_4_;
      if (iVar25 <= iVar7 && (iVar25 != iVar7 || auVar24._0_4_ <= auVar22._0_4_)) {
        pCVar5[uVar15 + 2].code = 0;
        pCVar5[uVar15 + 3].code = 0;
      }
      uVar15 = uVar15 + 4;
    } while (((uVar12 >> 3) + 4 & 0xfffffffffffffffc) != uVar15);
  }
  doSelection::maxTermHeads._nonemptyCells = 0;
  doSelection::maxTermHeads._size = 0;
  uVar12 = (ulong)eligible;
  ::Lib::DArray<Kernel::Literal_*>::ensure(&doSelection::litArr,uVar12);
  ppLVar11 = doSelection::litArr._array;
  if (eligible != 0) {
    lVar16 = uVar12 << 0x20;
    do {
      lVar16 = lVar16 + -0x100000000;
      ppLVar11[uVar12 - 1] = *(Literal **)((long)c->_literals + (lVar16 >> 0x1d));
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  local_c0.super_LiteralComparator._selector = (this->_comp).super_LiteralComparator._selector;
  local_c0._c1.super_LiteralComparator._selector =
       (this->_comp)._c1.super_LiteralComparator._selector;
  local_c0._c2.super_LiteralComparator._selector =
       (this->_comp)._c2.super_LiteralComparator._selector;
  local_c0._c2._c1.super_LiteralComparator._selector =
       (this->_comp)._c2._c1.super_LiteralComparator._selector;
  local_c0._c2._c2.super_LiteralComparator._selector =
       (this->_comp)._c2._c2.super_LiteralComparator._selector;
  local_c0._c2._c2._c1.super_LiteralComparator._selector =
       (this->_comp)._c2._c2._c1.super_LiteralComparator._selector;
  local_c0._c2._c2._c2.super_LiteralComparator._selector =
       (this->_comp)._c2._c2._c2.super_LiteralComparator._selector;
  local_c0._c2._c2._c2._c1.super_LiteralComparator._selector =
       (this->_comp)._c2._c2._c2._c1.super_LiteralComparator._selector;
  local_c0._c2._c2._c2._c2.super_LiteralComparator._selector =
       (this->_comp)._c2._c2._c2._c2.super_LiteralComparator._selector;
  local_c0.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)&PTR__Composite_00b68820;
  local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68330;
  local_c0._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68860;
  local_c0._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b688a0;
  local_c0._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b688e0;
  local_c0._c2._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b683b0;
  local_c0._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__Composite_00b68920;
  local_c0._c2._c2._c2._c1.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b68960;
  local_c0._c2._c2._c2._c2.super_LiteralComparator._vptr_LiteralComparator =
       (_func_int **)&PTR__LiteralComparator_00b683f0;
  local_d4 = eligible;
  local_c8 = this;
  ::Lib::DArray<Kernel::Literal*>::
  sortGen<true,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
            ((DArray<Kernel::Literal*> *)&doSelection::litArr,&local_c0);
  local_e0 = (LiteralList *)0x0;
  if ((doSelection::combSup == true) &&
     (fillMaximals(local_c8,&local_e0,&doSelection::litArr), local_e0 != (LiteralList *)0x0)) {
    pLVar13 = local_e0;
    do {
      pLVar13 = pLVar13->_tail;
      TVar8 = ApplicativeHelper::getHead((TermList)0x55eb60);
      TVar9 = ApplicativeHelper::getHead((TermList)0x55eb6b);
      if ((TVar8._content & 1) != 0) {
        uVar17 = (undefined4)(TVar8._content >> 2);
        local_c0.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_c0.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar17);
        uVar14 = 0x811c9dc5;
        lVar16 = 0;
        do {
          uVar14 = (*(byte *)((long)&local_c0.super_LiteralComparator._vptr_LiteralComparator +
                             lVar16) ^ uVar14) * 0x1000193;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_c0.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_c0.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar17);
        ::Lib::Set<unsigned_int,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<unsigned_int,Lib::DefaultHash> *)&doSelection::maxTermHeads,
                   (anon_class_8_1_ba1d8281)&local_c0,uVar14,(anon_class_8_1_ba1d8281)&local_c0,
                   (bool *)&local_d0);
      }
      if ((TVar9._content & 1) != 0) {
        uVar17 = (undefined4)(TVar9._content >> 2);
        local_c0.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_c0.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar17);
        uVar14 = 0x811c9dc5;
        lVar16 = 0;
        do {
          uVar14 = (*(byte *)((long)&local_c0.super_LiteralComparator._vptr_LiteralComparator +
                             lVar16) ^ uVar14) * 0x1000193;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 4);
        local_c0.super_LiteralComparator._vptr_LiteralComparator =
             (_func_int **)
             CONCAT44(local_c0.super_LiteralComparator._vptr_LiteralComparator._4_4_,uVar17);
        ::Lib::Set<unsigned_int,Lib::DefaultHash>::
        rawFindOrInsert<Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda()_1_,Lib::Set<unsigned_int,Lib::DefaultHash>::insert(unsigned_int,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<unsigned_int,Lib::DefaultHash> *)&doSelection::maxTermHeads,
                   (anon_class_8_1_ba1d8281)&local_c0,uVar14,(anon_class_8_1_ba1d8281)&local_c0,
                   (bool *)&local_d0);
      }
    } while (pLVar13 != (List<Kernel::Literal_*> *)0x0);
  }
  pCVar6 = local_c8;
  uVar14 = local_d4;
  pLVar18 = *doSelection::litArr._array;
  uVar19 = (uint)(pLVar18->super_Term)._args[0]._content;
  if ((pLVar18->super_Term)._functor == 0) {
    bVar21 = SUB41((uVar19 & 4) >> 2,0);
  }
  else {
    bVar21 = (local_c8->super_LiteralSelector)._reversePolarity != ((uVar19 >> 2 & 1) != 0);
  }
  if (bVar21 != false) {
    if (doSelection::combSup == false) {
      fillMaximals(local_c8,&local_e0,&doSelection::litArr);
    }
    uVar19 = 1;
    pLVar10 = local_e0;
    do {
      if ((pLVar10->_head == doSelection::litArr._array[uVar19 - 1]) &&
         (pLVar10 = pLVar10->_tail, pLVar10 == (LiteralList *)0x0)) {
        pLVar18 = (Literal *)0x0;
        break;
      }
      pLVar18 = doSelection::litArr._array[uVar19];
      uVar20 = (uint)(pLVar18->super_Term)._args[0]._content;
      if ((pLVar18->super_Term)._functor == 0) {
        bVar21 = SUB41((uVar20 & 4) >> 2,0);
      }
      else {
        bVar21 = (pCVar6->super_LiteralSelector)._reversePolarity != ((uVar20 >> 2 & 1) != 0);
      }
      uVar19 = uVar19 + 1;
    } while (bVar21 != false);
  }
  if (pLVar18 == (Literal *)0x0) {
    if (local_e0->_tail == (List<Kernel::Literal_*> *)0x0) {
      pLVar18 = local_e0->_head;
    }
    else {
      pLVar18 = (Literal *)0x0;
    }
  }
  if (pLVar18 == (Literal *)0x0) {
    uVar19 = 0;
    for (pLVar13 = local_e0; pLVar13 != (LiteralList *)0x0; pLVar13 = pLVar13->_tail) {
      uVar19 = uVar19 + 1;
    }
    if (uVar19 != uVar14) {
      if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
           ::doSelection(Kernel::Clause*,unsigned_int)::replaced == '\0') &&
         (iVar7 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                                       ::doSelection(Kernel::Clause*,unsigned_int)::replaced),
         iVar7 != 0)) {
        doSelection::replaced._capacity = 0x10;
        doSelection::replaced._stack = (Literal **)::operator_new(0x80,0x10);
        doSelection::replaced._end = doSelection::replaced._stack + doSelection::replaced._capacity;
        doSelection::replaced._cursor = doSelection::replaced._stack;
        __cxa_atexit(::Lib::Stack<Kernel::Literal_*>::~Stack,&doSelection::replaced,&__dso_handle);
        __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,Kernel::LiteralComparators::LexComparator>>>>>
                             ::doSelection(Kernel::Clause*,unsigned_int)::replaced);
      }
      uVar14 = 0;
      local_c0.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)0x0;
      local_c0.super_LiteralComparator._selector =
           (LiteralSelector *)
           ((ulong)local_c0.super_LiteralComparator._selector & 0xffffffff00000000);
      local_c0._c1.super_LiteralComparator._vptr_LiteralComparator = (_func_int **)0x0;
      ::Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::expand
                ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_c0);
      if (local_e0 != (LiteralList *)0x0) {
        pLVar13 = local_e0;
        do {
          local_d0 = pLVar13->_head;
          uVar19 = 0x811c9dc5;
          lVar16 = 0;
          do {
            uVar19 = (*(byte *)((long)&local_d0 + lVar16) ^ uVar19) * 0x1000193;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 8);
          ::Lib::Set<Kernel::Literal*,Lib::DefaultHash>::
          rawFindOrInsert<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Literal*,Lib::DefaultHash>::insert(Kernel::Literal*,unsigned_int)::_lambda(auto:1)_1_>
                    ((Set<Kernel::Literal*,Lib::DefaultHash> *)&local_c0,
                     (anon_class_8_1_ba1d8281)&local_d0,uVar19,(anon_class_8_1_ba1d8281)&local_d0,
                     &local_d5);
          pLVar13 = pLVar13->_tail;
        } while (pLVar13 != (List<Kernel::Literal_*> *)0x0);
      }
      if (local_e0 != (LiteralList *)0x0) {
        uVar14 = 0;
        do {
          bVar21 = ::Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                             ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_c0,
                              c->_literals[(int)uVar14]);
          if (!bVar21) {
            pLVar18 = c->_literals[(int)uVar14];
            if (doSelection::replaced._cursor == doSelection::replaced._end) {
              ::Lib::Stack<Kernel::Literal_*>::expand(&doSelection::replaced);
            }
            *doSelection::replaced._cursor = pLVar18;
            doSelection::replaced._cursor = doSelection::replaced._cursor + 1;
          }
          pLVar18 = local_e0->_head;
          pLVar10 = local_e0->_tail;
          local_e0->_head = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_e0;
          c->_literals[(int)uVar14] = pLVar18;
          uVar14 = uVar14 + 1;
          local_e0 = pLVar10;
        } while (pLVar10 != (LiteralList *)0x0);
      }
      if (doSelection::replaced._cursor != doSelection::replaced._stack) {
        uVar19 = uVar14;
        do {
          bVar21 = ::Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                             ((Set<Kernel::Literal_*,_Lib::DefaultHash> *)&local_c0,
                              c->_literals[(int)uVar19]);
          if (bVar21) {
            ppLVar11 = doSelection::replaced._cursor + -1;
            doSelection::replaced._cursor = doSelection::replaced._cursor + -1;
            c->_literals[(int)uVar19] = *ppLVar11;
            if (doSelection::replaced._cursor == doSelection::replaced._stack) break;
          }
          uVar19 = uVar19 + 1;
        } while( true );
      }
      *(ulong *)&c->field_0x38 =
           *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | (ulong)(uVar14 & 0xfffff) << 0x20;
      Clause::notifyLiteralReorder(c);
      uVar14 = local_d4;
      pLVar10 = local_e0;
      if (local_c0._c1.super_LiteralComparator._vptr_LiteralComparator != (_func_int **)0x0) {
        if ((long)(int)local_c0.super_LiteralComparator._vptr_LiteralComparator == 0) {
          *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
               (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ =
               local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
        }
        else {
          uVar12 = (long)(int)local_c0.super_LiteralComparator._vptr_LiteralComparator * 0x10;
          if (uVar12 < 0x11) {
            *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
                 (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ =
                 local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
          }
          else if (uVar12 < 0x19) {
            *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
                 (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ =
                 local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
          }
          else if (uVar12 < 0x21) {
            *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
                 (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ =
                 local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
          }
          else if (uVar12 < 0x31) {
            *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
                 (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ =
                 local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
          }
          else if (uVar12 < 0x41) {
            *local_c0._c1.super_LiteralComparator._vptr_LiteralComparator =
                 (_func_int *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ =
                 local_c0._c1.super_LiteralComparator._vptr_LiteralComparator;
          }
          else {
            operator_delete(local_c0._c1.super_LiteralComparator._vptr_LiteralComparator,0x10);
            pLVar10 = local_e0;
          }
        }
      }
      goto joined_r0x0055ed56;
    }
    *(ulong *)&c->field_0x38 =
         *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | (ulong)(uVar14 & 0xfffff) << 0x20;
  }
  else {
    uVar19 = Clause::getLiteralPosition(c,pLVar18);
    if (uVar19 != 0) {
      pLVar18 = c->_literals[0];
      c->_literals[0] = c->_literals[(int)uVar19];
      c->_literals[(int)uVar19] = pLVar18;
    }
    *(ulong *)&c->field_0x38 = *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | 0x100000000;
  }
  Clause::notifyLiteralReorder(c);
  pLVar10 = local_e0;
joined_r0x0055ed56:
  while (pLVar1 = pLVar10, pLVar1 != (LiteralList *)0x0) {
    pLVar10 = pLVar1->_tail;
    if (pLVar1 != (LiteralList *)0x0) {
      pLVar1->_head = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pLVar1;
    }
  }
  LiteralSelector::ensureSomeColoredSelected(c,uVar14);
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    ASS_G(eligible, 1); //trivial cases should be taken care of by the base LiteralSelector

    static bool combSup = env.options->combinatorySup();

    static DArray<Literal*> litArr(64);
    static Set<unsigned> maxTermHeads;
    maxTermHeads.reset();
    litArr.initFromArray(eligible,*c);
    litArr.sortInversed(_comp);

    LiteralList* maximals=0;
    Literal* singleSelected=0; //If equals to 0 in the end, all maximal

    if(combSup){ 
      fillMaximals(maximals, litArr); 
      LiteralList::Iterator maxIt(maximals);
      while(maxIt.hasNext()){
        Literal* lit = maxIt.next();
        TermList t0 = *lit->nthArgument(0);
        TermList t1 = *lit->nthArgument(1);
        TermList h0 = ApplicativeHelper::getHead(t0);  
        TermList h1 = ApplicativeHelper::getHead(t1);
        if(h0.isVar()){ maxTermHeads.insert(h0.var()); }
        if(h1.isVar()){ maxTermHeads.insert(h1.var()); }
      }
    }
    //literals will be selected.
    bool allSelected=false;

    if(isNegativeForSelection(litArr[0])) {
      singleSelected=litArr[0];
    } else {
      if(!combSup){ fillMaximals(maximals, litArr); }
      unsigned besti=0;
      LiteralList* nextMax=maximals;
      while(true) {
        if(nextMax->head()==litArr[besti]) {
          nextMax=nextMax->tail();
          if(nextMax==0) {
            break;
          }
        }
        besti++;
        ASS_L(besti,eligible);
        if(isNegativeForSelection(litArr[besti])){
          singleSelected=litArr[besti];
          break;
        }
      }
    }
    if(!singleSelected && !maximals->tail()) {
      //there is only one maximal literal
      singleSelected=maximals->head();
    }
    if(!singleSelected) {
      unsigned selCnt=0;
      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        ASS(isPositiveForSelection(mit->head()));
        selCnt++;
      }
      if(selCnt==eligible) {
        allSelected=true;
      }
    }
    if(allSelected) {
      c->setSelected(eligible);
    } else if(!singleSelected) {
      //select multiple maximal literals
      static Stack<Literal*> replaced(16);
      Set<Literal*> maxSet;
      unsigned selCnt=0;

      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        maxSet.insert(mit->head());
      }

      while(maximals) {
        if(!maxSet.contains((*c)[selCnt])) {
          replaced.push((*c)[selCnt]);
        }
        (*c)[selCnt]=LiteralList::pop(maximals);
        selCnt++;
      }
      ASS_G(selCnt,1);
      ASS_LE(selCnt,eligible);

      //put back non-selected literals that were removed
      unsigned i=selCnt;
      while(replaced.isNonEmpty()) {
        while(!maxSet.contains((*c)[i])) {
          i++;
          ASS_L(i,eligible);
        }
        (*c)[i++]=replaced.pop();
      }

      c->setSelected(selCnt);
    } else {
      unsigned besti=c->getLiteralPosition(singleSelected);
      if(besti!=0) {
        std::swap((*c)[0],(*c)[besti]);
      }
      c->setSelected(1);
    }
    LiteralList::destroy(maximals);

    ensureSomeColoredSelected(c, eligible);
  }